

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxv_basic.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  _func_void_double_1500__ptr *f;
  double (*args) [1500];
  ostream *poVar2;
  double (*in_RSI) [1500] [6000];
  char *pcVar3;
  undefined4 in_EDI;
  rep rVar4;
  bool test_ok;
  _func_void_double_1500__ptr_double_1500__6000__ptr_double_6000__ptr *unaff_retaddr;
  double parallel_time;
  double serial_time;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  t2;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  t1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  t0;
  int j;
  int i;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffa0;
  duration<double,_std::ratio<1L,_1L>_> in_stack_ffffffffffffffa8;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffffb0;
  duration<double,_std::ratio<1L,_1L>_> local_40;
  rep local_38;
  undefined8 local_30;
  int in_stack_ffffffffffffffe8;
  int iVar5;
  undefined4 uVar6;
  
  uVar6 = 0;
  printf("Using %d chunks\n",4);
  for (iVar5 = 0; iVar5 < 6000; iVar5 = iVar5 + 1) {
    v[iVar5] = (double)iVar5;
  }
  for (iVar5 = 0; iVar5 < 6000; iVar5 = iVar5 + 1) {
    result[iVar5] = 0.0;
    for (in_stack_ffffffffffffffe8 = 0; in_stack_ffffffffffffffe8 < 6000;
        in_stack_ffffffffffffffe8 = in_stack_ffffffffffffffe8 + 1) {
      mx[iVar5][in_stack_ffffffffffffffe8] = (double)(iVar5 + in_stack_ffffffffffffffe8);
    }
  }
  f = (_func_void_double_1500__ptr *)std::chrono::_V2::system_clock::now();
  mxv((Type (*) [1500])result,(Type (*) [1500] [6000])mx,&v);
  args = (double (*) [1500])std::chrono::_V2::system_clock::now();
  for (iVar5 = 0; iVar5 < 6000; iVar5 = iVar5 + 0x5dc) {
    depspawn::
    spawn<void(double(&)[1500],double_const(&)[1500][6000],double_const(&)[6000]),double(&)[1500],double_const(&)[1500][6000],double(&)[6000]>
              (unaff_retaddr,(double (*) [1500])CONCAT44(uVar6,in_EDI),in_RSI,
               (double (*) [6000])CONCAT44(iVar5,in_stack_ffffffffffffffe8));
    depspawn::spawn<void(double(&)[1500]),double(&)[1500]>(f,args);
  }
  depspawn::wait_for_all();
  local_30 = std::chrono::_V2::system_clock::now();
  std::chrono::operator-
            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_ffffffffffffffa8.__r,in_stack_ffffffffffffffa0);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffffb0,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffffa8.__r);
  local_38 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_40);
  std::chrono::operator-
            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_ffffffffffffffa8.__r,in_stack_ffffffffffffffa0);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffffb0,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffffa8.__r);
  rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                    ((duration<double,_std::ratio<1L,_1L>_> *)&stack0xffffffffffffffa8);
  poVar2 = std::operator<<((ostream *)&std::cout,"Serial time: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_38);
  poVar2 = std::operator<<(poVar2,"s.  Parallel time: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar4);
  std::operator<<(poVar2,"s.\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"Speedup (using ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
  poVar2 = std::operator<<(poVar2," chunks): ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_38 / rVar4);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  bVar1 = test();
  poVar2 = std::operator<<((ostream *)&std::cout,"TEST ");
  pcVar3 = "UNSUCCESSFUL";
  if (bVar1) {
    pcVar3 = "SUCCESSFUL";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return (int)((bVar1 ^ 0xffU) & 1);
}

Assistant:

int main(int argc, char **argv)
{ int i, j;
  
  assert(!(M % CHUNKS));
  
  printf("Using %d chunks\n", CHUNKS);

  for (i = 0; i < N; i++) {
    v[i] = i;
  }
  
  for (i = 0; i < M; i++) {
    result[i] = 0;
    for( j = 0; j < N; j++)
      mx[i][j] = i + j;
  }
  
  std::chrono::time_point<std::chrono::high_resolution_clock> t0 = std::chrono::high_resolution_clock::now();
  
  mxv( (Type (&)[BCK])result, (const Type (&)[BCK][N])mx, (const Type (&) [N])v);
  
  std::chrono::time_point<std::chrono::high_resolution_clock> t1 = std::chrono::high_resolution_clock::now();

  //matrix - vector product using CHUNKS chunks
  for(i = 0; i < M; i+= BCK) {
    spawn(mxv, (Type (&)[BCK])(result[i]), (const Type (&)[BCK][N]) (mx[i][0]), v);
    // Does not work without casting mxv(result[i], (mx[i][0]), v);
    spawn(pica, (Type (&)[BCK])(result[i]));
  }

  wait_for_all();
  
  std::chrono::time_point<std::chrono::high_resolution_clock> t2 = std::chrono::high_resolution_clock::now();
  
  double serial_time = std::chrono::duration<double>(t1-t0).count();
  double parallel_time = std::chrono::duration<double>(t2-t1).count();
  
  std::cout << "Serial time: " << serial_time << "s.  Parallel time: " << parallel_time << "s.\n";
  std::cout << "Speedup (using " << CHUNKS << " chunks): " <<  (serial_time / parallel_time) << std::endl;
  
  const bool test_ok = test();
  
  std::cout << "TEST " << (test_ok ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  return !test_ok;
}